

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O2

string * __thiscall
wallet::walletload_tests::DummyDescriptor::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DummyDescriptor *this,bool compat_format)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&this->desc);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(bool compat_format) const override { return desc; }